

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPackage.cpp
# Opt level: O0

Symbol * slang::ast::builtins::createWeakReference(Compilation *c)

{
  GenericClassDefSymbol *__str;
  GenericClassDefSymbol *weakRef;
  anon_class_1_0_00000001 specialize;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff78;
  ParameterDecl *decl;
  GenericClassDefSymbol *in_stack_ffffffffffffff80;
  char (*in_stack_ffffffffffffff88) [15];
  Compilation *in_stack_ffffffffffffff90;
  ParameterDecl *in_stack_ffffffffffffff98;
  SourceLocation in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffa8;
  Type *in_stack_ffffffffffffffc0;
  
  __str = Compilation::
          allocGenericClass<char_const(&)[15],slang::SourceLocation_const&,slang::ast::builtins::createWeakReference(slang::ast::Compilation&)::__0&>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (SourceLocation *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
             (char *)__str);
  decl = (ParameterDecl *)0x0;
  DefinitionSymbol::ParameterDecl::ParameterDecl
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,true,true
             ,in_stack_ffffffffffffffc0);
  GenericClassDefSymbol::addParameterDecl(in_stack_ffffffffffffff80,decl);
  return &__str->super_Symbol;
}

Assistant:

static const Symbol& createWeakReference(Compilation& c) {
    auto specialize = [](Compilation& c, ClassType& ct, SourceLocation instanceLoc) {
        // Get a reference to the type parameter so we can use it
        // for functions that we build.
        auto& typeParam = ct.find<TypeParameterSymbol>("T");
        auto& t = typeParam.targetType.getType();

        if (!t.isClass() && !t.isError())
            ct.addDiag(diag::TypeIsNotAClass, instanceLoc) << t;

        if (auto lv = c.languageVersion(); lv < LanguageVersion::v1800_2023)
            ct.addDiag(diag::WrongLanguageVersion, instanceLoc) << toString(lv);

        ClassBuilder builder(c, ct);

        auto& void_t = c.getVoidType();

        auto ctor = builder.addMethod("new", void_t);
        ctor.addFlags(MethodFlags::Constructor);
        ctor.addArg("referent", t, ArgumentDirection::In);

        builder.addMethod("get", t);
        builder.addMethod("clear", void_t);

        auto get_id = builder.addMethod("get_id", c.getType(SyntaxKind::LongIntType));
        get_id.addArg("obj", t, ArgumentDirection::In);
        get_id.addFlags(MethodFlags::Static);
    };

    auto& weakRef = *c.allocGenericClass("weak_reference", NL, specialize);
    weakRef.addParameterDecl(DefinitionSymbol::ParameterDecl("T", NL, false, true, nullptr));

    return weakRef;
}